

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O3

void M_StartupSkillMenu(FGameStartup *gs)

{
  FMenuDescriptor *this;
  int *piVar1;
  FListMenuItem **ppFVar2;
  char *text;
  long *plVar3;
  Node *pNVar4;
  uint uVar5;
  FTextureID patch;
  EColorRange color;
  uint uVar6;
  long *plVar7;
  FListMenuItemText *this_00;
  FString *pFVar8;
  FMenuDescriptor *pFVar9;
  Node *pNVar10;
  FOptionMenuItem *this_01;
  int iVar11;
  Node *pNVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int y;
  FSkillInfo *pFVar17;
  char *pcVar18;
  int iVar19;
  FString *pFVar20;
  FName n;
  FName local_50;
  FName local_4c;
  ulong local_48;
  FMenuDescriptor *local_40;
  FMenuDescriptor *local_38;
  
  plVar3 = (long *)((long)&(MenuDescriptors.Nodes)->Next +
                   (ulong)((MenuDescriptors.Size - 1 & 0x1f7) * 0x18));
  do {
    plVar7 = plVar3;
    if ((plVar7 == (long *)0x0) || ((long *)*plVar7 == (long *)0x1)) goto LAB_0031101c;
    plVar3 = (long *)*plVar7;
  } while ((int)plVar7[1] != 0x1f7);
  pFVar9 = (FMenuDescriptor *)plVar7[2];
  if (pFVar9->mType != 0) {
    uVar6 = *(uint *)&pFVar9[1].field_0xc;
    if (uVar6 != 0) {
      uVar15 = 0;
      do {
        if (pFVar9[1]._vptr_FMenuDescriptor[uVar15] != (_func_int *)0x0) {
          (**(code **)(*(long *)pFVar9[1]._vptr_FMenuDescriptor[uVar15] + 8))();
          uVar6 = *(uint *)&pFVar9[1].field_0xc;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar6);
      if (uVar6 != 0) {
        *(undefined4 *)&pFVar9[1].field_0xc = 0;
      }
    }
    goto LAB_003110b7;
  }
  iVar11 = *(int *)((long)&pFVar9[1].mClass + 4);
  y = *(int *)&pFVar9[2]._vptr_FMenuDescriptor;
  this = pFVar9 + 1;
  if (*(int *)&pFVar9[1].field_0xc != 0) {
    uVar15 = 0;
LAB_00310cae:
    (*((FListMenuItem *)this->_vptr_FMenuDescriptor[uVar15])->_vptr_FListMenuItem[7])
              (&n,(FListMenuItem *)this->_vptr_FMenuDescriptor[uVar15],0);
    if ((n.Index & 0xfffffffeU) != 0x1f8) goto code_r0x00310ccf;
    uVar6 = *(uint *)&pFVar9[1].field_0xc;
    uVar5 = (uint)uVar15;
    uVar16 = uVar15;
    if (uVar5 < uVar6) {
      do {
        if ((FListMenuItem *)this->_vptr_FMenuDescriptor[uVar16] != (FListMenuItem *)0x0) {
          (*((FListMenuItem *)this->_vptr_FMenuDescriptor[uVar16])->_vptr_FListMenuItem[1])();
          uVar6 = *(uint *)&pFVar9[1].field_0xc;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar6);
    }
    if (uVar6 < uVar5) {
      TArray<FListMenuItem_*,_FListMenuItem_*>::Grow
                ((TArray<FListMenuItem_*,_FListMenuItem_*> *)this,uVar5 - uVar6);
    }
    *(uint *)&pFVar9[1].field_0xc = uVar5;
    local_48 = uVar15;
    goto LAB_00310d28;
  }
  local_48 = 0;
LAB_00310d28:
  uVar6 = AllSkills.Count;
  if (M_StartupSkillMenu::done != restart) {
    M_StartupSkillMenu::done = restart;
    uVar5 = AllSkills.Count - 1 >> 1;
    if ((uint)DefaultSkill < AllSkills.Count) {
      uVar5 = DefaultSkill;
    }
    iVar19 = (int)local_48;
    *(uint *)&pFVar9[1].mNetgameMessage.Chars = uVar5 + iVar19;
    iVar14 = y;
    if (iVar19 != 0) {
      uVar15 = 0;
      do {
        iVar13 = ((FListMenuItem *)this->_vptr_FMenuDescriptor[uVar15])->mYpos;
        if (iVar13 < iVar14) {
          iVar14 = iVar13;
        }
        uVar15 = uVar15 + 1;
      } while ((local_48 & 0xffffffff) != uVar15);
    }
    iVar13 = (y - iVar14) + *(int *)&pFVar9[2].field_0xc * uVar6;
    if (uVar6 != 1 && 0xbd < iVar13) {
      (*pFVar9->_vptr_FMenuDescriptor[1])(pFVar9);
      M_StartupSkillMenu::done = 0;
LAB_0031101c:
      pFVar9 = (FMenuDescriptor *)operator_new(0x60);
      (pFVar9->mMenuName).Index = 0;
      (pFVar9->mNetgameMessage).Chars = FString::NullString.Nothing;
      pFVar9->_vptr_FMenuDescriptor = (_func_int **)&PTR__FOptionMenuDescriptor_006edd68;
      pFVar9[1]._vptr_FMenuDescriptor = (_func_int **)0x0;
      *(undefined8 *)&pFVar9[1].mMenuName = 0;
      pFVar9[1].mNetgameMessage.Chars = FString::NullString.Nothing;
      FString::NullString.RefCount = FString::NullString.RefCount + 2;
      n.Index = 0x1f7;
      pNVar10 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>
                ::GetNode(&MenuDescriptors,&n);
      (pNVar10->Pair).Value = pFVar9;
      pFVar9->mType = 1;
      (pFVar9->mMenuName).Index = 0x1f7;
      FString::operator=(&pFVar9[1].mNetgameMessage,"$MNU_CHOOSESKILL");
      pFVar9[1].mType = 0;
      pFVar9->mClass = (PClass *)0x0;
      pFVar9[1].mClass = (PClass *)0x0;
      pFVar9[2]._vptr_FMenuDescriptor = (_func_int **)0xfffffff1000000a0;
      *(undefined1 *)&pFVar9[2].mMenuName.Index = 0;
LAB_003110b7:
      if (AllSkills.Count != 0) {
        uVar15 = 0;
        do {
          pFVar17 = AllSkills.Array;
          pcVar18 = "Startgame";
          if ((AllSkills.Array[uVar15].MustConfirm == true) &&
             (pcVar18 = "StartgameConfirm", AllEpisodes.Array[gs->Episode].mNoSkill != false)) {
            pcVar18 = "Startgame";
          }
          if (gs->PlayerClass == (char *)0x0) {
            pFVar20 = (FString *)0x0;
          }
          else {
            uVar6 = FName::NameManager::FindName(&FName::NameData,gs->PlayerClass,false);
            pNVar4 = pFVar17[uVar15].MenuNamesForPlayerClass.Nodes +
                     (pFVar17[uVar15].MenuNamesForPlayerClass.Size - 1 & uVar6);
            do {
              pNVar12 = pNVar4;
              if ((pNVar12 == (Node *)0x0) || (pNVar12->Next == (Node *)0x1)) {
                pNVar12 = (Node *)0x0;
                break;
              }
              pNVar4 = pNVar12->Next;
            } while ((pNVar12->Pair).Key.Index != uVar6);
            pFVar20 = &(pNVar12->Pair).Value;
            if (pNVar12 == (Node *)0x0) {
              pFVar20 = (FString *)0x0;
            }
          }
          this_01 = (FOptionMenuItem *)operator_new(0x28);
          pFVar8 = &pFVar17[uVar15].MenuName;
          if (pFVar20 != (FString *)0x0) {
            pFVar8 = pFVar20;
          }
          text = pFVar8->Chars;
          n.Index = FName::NameManager::FindName(&FName::NameData,pcVar18,false);
          FOptionMenuItem::FOptionMenuItem(this_01,text,&n,false);
          (this_01->super_FListMenuItem)._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_006edda0;
          *(int *)&this_01->field_0x24 = (int)uVar15;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(pFVar9 + 1),1);
          uVar6 = *(uint *)&pFVar9[1].field_0xc;
          pFVar9[1]._vptr_FMenuDescriptor[uVar6] = (_func_int *)this_01;
          *(uint *)&pFVar9[1].field_0xc = uVar6 + 1;
          uVar16 = (ulong)AllSkills.Count;
          if (M_StartupSkillMenu::done == 0) {
            M_StartupSkillMenu::done = 1;
            uVar6 = AllSkills.Count - 1 >> 1;
            if ((uint)DefaultSkill < AllSkills.Count) {
              uVar6 = DefaultSkill;
            }
            pFVar9[1].mType = uVar6;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < uVar16);
      }
      return;
    }
    iVar13 = iVar14 - iVar13;
    iVar14 = ((iVar13 - (iVar13 + 200 >> 0x1f)) + 200 >> 1) - iVar14;
    if (iVar14 < 0) {
      if (iVar19 != 0) {
        ppFVar2 = (FListMenuItem **)this->_vptr_FMenuDescriptor;
        uVar15 = 0;
        do {
          piVar1 = &ppFVar2[uVar15]->mYpos;
          *piVar1 = *piVar1 + iVar14;
          uVar15 = uVar15 + 1;
        } while ((local_48 & 0xffffffff) != uVar15);
      }
      y = y - iVar14;
      *(int *)&pFVar9[2]._vptr_FMenuDescriptor = y;
    }
  }
  local_40 = pFVar9;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    uVar15 = 0;
    local_38 = this;
    do {
      pFVar9 = local_40;
      uVar6 = 0x1f8;
      if (AllSkills.Array[uVar15].MustConfirm == true) {
        uVar6 = AllEpisodes.Array[gs->Episode].mNoSkill ^ 0x1f9;
      }
      pFVar17 = AllSkills.Array + uVar15;
      if (gs->PlayerClass == (char *)0x0) {
        pFVar20 = (FString *)0x0;
      }
      else {
        uVar5 = FName::NameManager::FindName(&FName::NameData,gs->PlayerClass,false);
        pNVar4 = (pFVar17->MenuNamesForPlayerClass).Nodes +
                 ((pFVar17->MenuNamesForPlayerClass).Size - 1 & uVar5);
        do {
          pNVar12 = pNVar4;
          if ((pNVar12 == (Node *)0x0) || (pNVar12->Next == (Node *)0x1)) {
            pNVar12 = (Node *)0x0;
            break;
          }
          pNVar4 = pNVar12->Next;
        } while ((pNVar12->Pair).Key.Index != uVar5);
        pFVar20 = &(pNVar12->Pair).Value;
        if (pNVar12 == (Node *)0x0) {
          pFVar20 = (FString *)0x0;
        }
      }
      if ((pFVar20 == (FString *)0x0) &&
         (pcVar18 = (pFVar17->PicName).Chars, *(int *)(pcVar18 + -0xc) != 0)) {
        patch = GetMenuTexture(pcVar18);
        this_00 = (FListMenuItemText *)operator_new(0x28);
        local_4c.Index = uVar6;
        FListMenuItemPatch::FListMenuItemPatch
                  ((FListMenuItemPatch *)this_00,*(int *)((long)&pFVar9[1].mClass + 4),y,
                   *(int *)&pFVar9[2].field_0xc,(int)pFVar17->Shortcut,patch,&local_4c,(int)uVar15);
      }
      else {
        color = FSkillInfo::GetTextColor(pFVar17);
        if (color == CR_UNTRANSLATED) {
          color = *(EColorRange *)&pFVar9[2].mClass;
        }
        this_00 = (FListMenuItemText *)operator_new(0x40);
        pFVar8 = &pFVar17->MenuName;
        if (pFVar20 != (FString *)0x0) {
          pFVar8 = pFVar20;
        }
        local_50.Index = uVar6;
        FListMenuItemText::FListMenuItemText
                  (this_00,iVar11,y,*(int *)&pFVar9[2].field_0xc,(int)pFVar17->Shortcut,
                   pFVar8->Chars,*(FFont **)&pFVar9[2].mType,color,
                   *(EColorRange *)((long)&pFVar9[2].mClass + 4),&local_50,(int)uVar15);
      }
      TArray<FListMenuItem_*,_FListMenuItem_*>::Grow
                ((TArray<FListMenuItem_*,_FListMenuItem_*> *)local_38,1);
      uVar6 = *(uint *)&local_40[1].field_0xc;
      local_40[1]._vptr_FMenuDescriptor[uVar6] = (_func_int *)this_00;
      *(uint *)&local_40[1].field_0xc = uVar6 + 1;
      y = y + *(int *)&local_40[2].field_0xc;
      uVar15 = uVar15 + 1;
      uVar6 = AllSkills.Count;
    } while (uVar15 < AllSkills.Count);
  }
  if ((uVar6 == 1) || (iVar11 = -1, AllEpisodes.Array[gs->Episode].mNoSkill != false)) {
    uVar5 = uVar6 - 1 >> 1;
    if ((uint)DefaultSkill < uVar6) {
      uVar5 = DefaultSkill;
    }
    iVar11 = uVar5 + (int)local_48;
  }
  *(int *)&local_40[2].mNetgameMessage.Chars = iVar11;
  return;
code_r0x00310ccf:
  uVar15 = uVar15 + 1;
  if (*(uint *)&pFVar9[1].field_0xc <= uVar15) goto code_r0x00310cdb;
  goto LAB_00310cae;
code_r0x00310cdb:
  local_48 = (ulong)*(uint *)&pFVar9[1].field_0xc;
  goto LAB_00310d28;
}

Assistant:

void M_StartupSkillMenu(FGameStartup *gs)
{
	static int done = -1;
	bool success = false;
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_Skillmenu);
	if (desc != NULL)
	{
		if ((*desc)->mType == MDESC_ListMenu)
		{
			FListMenuDescriptor *ld = static_cast<FListMenuDescriptor*>(*desc);
			int x = ld->mXpos;
			int y = ld->mYpos;

			// Delete previous contents
			for(unsigned i=0; i<ld->mItems.Size(); i++)
			{
				FName n = ld->mItems[i]->GetAction(NULL);
				if (n == NAME_Startgame || n == NAME_StartgameConfirm) 
				{
					for(unsigned j=i; j<ld->mItems.Size(); j++)
					{
						delete ld->mItems[j];
					}
					ld->mItems.Resize(i);
					break;
				}
			}

			if (done != restart)
			{
				done = restart;
				int defskill = DefaultSkill;
				if ((unsigned int)defskill >= AllSkills.Size())
				{
					defskill = (AllSkills.Size() - 1) / 2;
				}
				ld->mSelectedItem = ld->mItems.Size() + defskill;

				int posy = y;
				int topy = posy;

				// Get lowest y coordinate of any static item in the menu
				for(unsigned i = 0; i < ld->mItems.Size(); i++)
				{
					int y = ld->mItems[i]->GetY();
					if (y < topy) topy = y;
				}

				// center the menu on the screen if the top space is larger than the bottom space
				int totalheight = posy + AllSkills.Size() * ld->mLinespacing - topy;

				if (totalheight < 190 || AllSkills.Size() == 1)
				{
					int newtop = (200 - totalheight + topy) / 2;
					int topdelta = newtop - topy;
					if (topdelta < 0)
					{
						for(unsigned i = 0; i < ld->mItems.Size(); i++)
						{
							ld->mItems[i]->OffsetPositionY(topdelta);
						}
						y = ld->mYpos = posy - topdelta;
					}
				}
				else
				{
					// too large
					delete ld;
					desc = NULL;
					done = false;
					goto fail;
				}
			}

			unsigned firstitem = ld->mItems.Size();
			for(unsigned int i = 0; i < AllSkills.Size(); i++)
			{
				FSkillInfo &skill = AllSkills[i];
				FListMenuItem *li;
				// Using a different name for skills that must be confirmed makes handling this easier.
				FName action = (skill.MustConfirm && !AllEpisodes[gs->Episode].mNoSkill) ?
					NAME_StartgameConfirm : NAME_Startgame;
				FString *pItemText = NULL;
				if (gs->PlayerClass != NULL)
				{
					pItemText = skill.MenuNamesForPlayerClass.CheckKey(gs->PlayerClass);
				}

				if (skill.PicName.Len() != 0 && pItemText == NULL)
				{
					FTextureID tex = GetMenuTexture(skill.PicName);
					li = new FListMenuItemPatch(ld->mXpos, y, ld->mLinespacing, skill.Shortcut, tex, action, i);
				}
				else
				{
					EColorRange color = (EColorRange)skill.GetTextColor();
					if (color == CR_UNTRANSLATED) color = ld->mFontColor;
					li = new FListMenuItemText(x, y, ld->mLinespacing, skill.Shortcut, 
									pItemText? *pItemText : skill.MenuName, ld->mFont, color,ld->mFontColor2, action, i);
				}
				ld->mItems.Push(li);
				y += ld->mLinespacing;
			}
			if (AllEpisodes[gs->Episode].mNoSkill || AllSkills.Size() == 1)
			{
				ld->mAutoselect = firstitem + M_GetDefaultSkill();
			}
			else
			{
				ld->mAutoselect = -1;
			}
			success = true;
		}
	}
	if (success) return;
fail:
	// Option menu fallback for overlong skill lists
	FOptionMenuDescriptor *od;
	if (desc == NULL)
	{
		od = new FOptionMenuDescriptor;
		if (desc != NULL) delete *desc;
		MenuDescriptors[NAME_Skillmenu] = od;
		od->mType = MDESC_OptionsMenu;
		od->mMenuName = NAME_Skillmenu;
		od->mTitle = "$MNU_CHOOSESKILL";
		od->mSelectedItem = 0;
		od->mScrollPos = 0;
		od->mClass = NULL;
		od->mPosition = -15;
		od->mScrollTop = 0;
		od->mIndent = 160;
		od->mDontDim = false;
	}
	else
	{
		od = static_cast<FOptionMenuDescriptor*>(*desc);
		for(unsigned i=0;i<od->mItems.Size(); i++)
		{
			delete od->mItems[i];
		}
		od->mItems.Clear();
	}
	for(unsigned int i = 0; i < AllSkills.Size(); i++)
	{
		FSkillInfo &skill = AllSkills[i];
		FOptionMenuItem *li;
		// Using a different name for skills that must be confirmed makes handling this easier.
		const char *action = (skill.MustConfirm && !AllEpisodes[gs->Episode].mNoSkill) ?
			"StartgameConfirm" : "Startgame";

		FString *pItemText = NULL;
		if (gs->PlayerClass != NULL)
		{
			pItemText = skill.MenuNamesForPlayerClass.CheckKey(gs->PlayerClass);
		}
		li = new FOptionMenuItemSubmenu(pItemText? *pItemText : skill.MenuName, action, i);
		od->mItems.Push(li);
		if (!done)
		{
			done = true;
			od->mSelectedItem = M_GetDefaultSkill();
		}
	}
}